

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

char __thiscall lexer::Lexer::peekChar(Lexer *this)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  Lexer *this_local;
  
  iVar1 = this->readPosition;
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (&this->input);
  if (iVar1 < (int)sVar2) {
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                       (&this->input,(long)this->readPosition);
    this_local._7_1_ = *pvVar3;
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

char Lexer::peekChar()
{
    if(readPosition >= (int) input.size()){
        return 0;
    }else{
        return input.at(readPosition);
    }
}